

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Scatter_flat64(int g_a,void *v,int64_t *subsArray,int64_t n)

{
  Integer IVar1;
  void *subscript;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  
  IVar1 = pnga_ndim((long)g_a);
  subscript = malloc((int)IVar1 * n * 8);
  if (subscript == (void *)0x0) {
    pnga_error("Memory allocation failed.",0);
  }
  lVar2 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  lVar4 = 0;
  if (0 < n) {
    lVar4 = n;
  }
  lVar5 = IVar1 * 8 + -8 + (long)subscript;
  for (; lVar2 != lVar4; lVar2 = lVar2 + 1) {
    plVar6 = subsArray;
    for (lVar7 = 0; -lVar7 != lVar3; lVar7 = lVar7 + -1) {
      *(long *)(lVar5 + lVar7 * 8) = *plVar6 + 1;
      plVar6 = plVar6 + 1;
    }
    subsArray = subsArray + IVar1;
    lVar5 = lVar5 + IVar1 * 8;
  }
  pnga_scatter((long)g_a,v,subscript,0,n);
  free(subscript);
  return;
}

Assistant:

void NGA_Scatter_flat64(int g_a, void *v, int64_t subsArray[], int64_t n)
{
    int idx, i;
    Integer a = (Integer)g_a;
    Integer nv = (Integer)n;
    Integer ndim = wnga_ndim(a);
    Integer *_subs_array;
    _subs_array = (Integer *)malloc((int)ndim* n * sizeof(Integer));
    if(_subs_array == NULL) GA_Error("Memory allocation failed.", 0);

    /* adjust the indices for fortran interface */
    for(idx=0; idx<n; idx++)
        for(i=0; i<ndim; i++)
            _subs_array[idx*ndim+(ndim-i-1)] = subsArray[idx*ndim+i] + 1;
    
    wnga_scatter(a, v, _subs_array, 0, nv);
    
    free(_subs_array);
}